

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O1

SpatialForceVector * __thiscall
iDynTree::TransformDerivative::transform
          (SpatialForceVector *__return_storage_ptr__,TransformDerivative *this,Transform *transform
          ,SpatialForceVector *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  PointerType ptr;
  Position *pPVar21;
  Rotation *pRVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015fc98
  ;
  pPVar21 = Transform::getPosition(transform);
  pRVar22 = Transform::getRotation(transform);
  dVar8 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [0];
  dVar9 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [1];
  dVar10 = (this->rotDerivative).m_data[0];
  dVar11 = (this->rotDerivative).m_data[1];
  dVar12 = (this->rotDerivative).m_data[2];
  dVar13 = (this->rotDerivative).m_data[3];
  dVar14 = (this->rotDerivative).m_data[4];
  dVar15 = (this->rotDerivative).m_data[6];
  dVar16 = (this->rotDerivative).m_data[7];
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [2];
  dVar2 = (this->rotDerivative).m_data[5];
  dVar3 = (this->rotDerivative).m_data[8];
  dVar26 = dVar1 * dVar3 + dVar9 * dVar16 + dVar8 * dVar15;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = dVar1 * dVar12 + dVar11 * dVar9 + dVar10 * dVar8;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = dVar1 * dVar2 + dVar9 * dVar14 + dVar8 * dVar13;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = dVar26;
  dVar4 = (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
          super_Vector3.m_data[0];
  dVar5 = (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
          super_Vector3.m_data[1];
  dVar6 = (pPVar21->super_Vector3).m_data[0];
  dVar17 = (pPVar21->super_Vector3).m_data[1];
  dVar18 = (pPVar21->super_Vector3).m_data[2];
  dVar23 = dVar1 * (pRVar22->super_Matrix3x3).m_data[5] +
           (pRVar22->super_Matrix3x3).m_data[4] * dVar9 +
           (pRVar22->super_Matrix3x3).m_data[3] * dVar8;
  dVar7 = (this->posDerivative).m_data[0];
  dVar24 = (pRVar22->super_Matrix3x3).m_data[8] * dVar1 +
           (pRVar22->super_Matrix3x3).m_data[7] * dVar9 +
           (pRVar22->super_Matrix3x3).m_data[6] * dVar8;
  dVar25 = (pRVar22->super_Matrix3x3).m_data[2] * dVar1 +
           (pRVar22->super_Matrix3x3).m_data[1] * dVar9 +
           (pRVar22->super_Matrix3x3).m_data[0] * dVar8;
  dVar8 = (this->posDerivative).m_data[1];
  dVar9 = (this->posDerivative).m_data[2];
  dVar19 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
           m_data[0];
  dVar20 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
           m_data[1];
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
          m_data[2];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] =
       dVar1 * dVar12 + dVar11 * dVar20 + dVar10 * dVar19 + (dVar26 * dVar17 - dVar5 * dVar18) +
       (dVar8 * dVar24 - dVar23 * dVar9);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] =
       dVar1 * dVar2 + dVar14 * dVar20 + dVar13 * dVar19 + (dVar4 * dVar18 - dVar26 * dVar6) +
       (dVar9 * dVar25 - dVar24 * dVar7);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] =
       (dVar6 * dVar5 - dVar4 * dVar17) + dVar16 * dVar20 + dVar15 * dVar19 + dVar3 * dVar1 +
       (dVar7 * dVar23 - dVar25 * dVar8);
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector TransformDerivative::transform(const Transform& transform,
                                                  SpatialForceVector& other)
{
    SpatialForceVector ret;

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());
    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    toEigen(ret.getLinearVec3()) = dR*toEigen(other.getLinearVec3());
    toEigen(ret.getAngularVec3())  =  dR*toEigen(other.getAngularVec3())
                                    + p.cross(toEigen(ret.getLinearVec3()))
                                    + dp.cross(R*toEigen(other.getLinearVec3()));

    return ret;
}